

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

void __thiscall GenericModelItem::removeRows(GenericModelItem *this,int row,int count)

{
  QVector<GenericModelItem_*> *this_00;
  const_iterator aend;
  int iVar1;
  int iVar2;
  const_iterator cVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  const_iterator cVar7;
  
  if (0 < this->m_colCount) {
    this_00 = &this->children;
    iVar4 = QList<GenericModelItem_*>::begin(this_00);
    iVar1 = this->m_colCount;
    iVar5 = QList<GenericModelItem_*>::begin(this_00);
    iVar2 = this->m_colCount;
    iVar6 = QList<GenericModelItem_*>::end(this_00);
    aend.i = iVar4.i + (long)(count + row) * (long)iVar1;
    for (cVar7.i = aend.i; cVar3.i = iVar5.i + (long)row * (long)iVar2, cVar7.i != iVar6.i;
        cVar7.i = cVar7.i + 1) {
      (*cVar7.i)->m_row = (*cVar7.i)->m_row - count;
    }
    for (; cVar3.i != aend.i; cVar3.i = cVar3.i + 1) {
      if (*cVar3.i != (GenericModelItem *)0x0) {
        (*(*cVar3.i)->_vptr_GenericModelItem[1])();
      }
    }
    QList<GenericModelItem_*>::erase
              (this_00,(const_iterator)(iVar5.i + (long)row * (long)iVar2),aend);
  }
  this->m_rowCount = this->m_rowCount - count;
  return;
}

Assistant:

void GenericModelItem::removeRows(int row, int count)
{
    if (m_colCount > 0) {
        Q_ASSERT((row + count) * m_colCount <= children.size());
        const auto endRemoveIter = children.begin() + ((row + count) * m_colCount);
        const auto startRemoveIter = children.begin() + (row * m_colCount);
        for (auto i = endRemoveIter, iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row -= count;
        qDeleteAll(startRemoveIter, endRemoveIter);
        children.erase(startRemoveIter, endRemoveIter);
    }
    m_rowCount -= count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}